

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRasterizationTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles3::Functional::anon_unknown_1::CullingTest::triangleOrder
          (CullingTest *this,Vec4 *v0,Vec4 *v1,Vec4 *v2)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined1 local_58 [8];
  Vector<float,_2> local_50;
  Vec2 s2;
  Vector<float,_2> local_40;
  Vec2 s1;
  Vector<float,_2> local_30;
  Vec2 s0;
  Vec4 *v2_local;
  Vec4 *v1_local;
  Vec4 *v0_local;
  CullingTest *this_local;
  
  s0.m_data = (float  [2])v2;
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)&s1,(int)v0,0);
  fVar1 = tcu::Vector<float,_4>::w(v0);
  tcu::operator/((tcu *)&local_30,&s1,fVar1);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)&s2,(int)v1,0);
  fVar1 = tcu::Vector<float,_4>::w(v1);
  tcu::operator/((tcu *)&local_40,&s2,fVar1);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_58,(int)s0.m_data[0],0);
  fVar1 = tcu::Vector<float,_4>::w((Vector<float,_4> *)s0.m_data);
  tcu::operator/((tcu *)&local_50,(Vector<float,_2> *)local_58,fVar1);
  fVar1 = tcu::Vector<float,_2>::x(&local_40);
  fVar2 = tcu::Vector<float,_2>::x(&local_30);
  fVar3 = tcu::Vector<float,_2>::y(&local_50);
  fVar4 = tcu::Vector<float,_2>::y(&local_30);
  fVar5 = tcu::Vector<float,_2>::x(&local_50);
  fVar6 = tcu::Vector<float,_2>::x(&local_30);
  fVar7 = tcu::Vector<float,_2>::y(&local_40);
  fVar8 = tcu::Vector<float,_2>::y(&local_30);
  return (fVar1 - fVar2) * (fVar3 - fVar4) + -((fVar5 - fVar6) * (fVar7 - fVar8)) < 0.0;
}

Assistant:

bool CullingTest::triangleOrder (const tcu::Vec4& v0, const tcu::Vec4& v1, const tcu::Vec4& v2) const
{
	const tcu::Vec2 s0 = v0.swizzle(0, 1) / v0.w();
	const tcu::Vec2 s1 = v1.swizzle(0, 1) / v1.w();
	const tcu::Vec2 s2 = v2.swizzle(0, 1) / v2.w();

	// cross
	return ((s1.x() - s0.x()) * (s2.y() - s0.y()) - (s2.x() - s0.x()) * (s1.y() - s0.y())) < 0;
}